

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dbfc4::CpuImmediateTest_ora_Test::~CpuImmediateTest_ora_Test
          (CpuImmediateTest_ora_Test *this)

{
  CpuImmediateTest_ora_Test *this_local;
  
  ~CpuImmediateTest_ora_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuImmediateTest, ora) {
    registers.a = 0b10101010;
    registers.p = Z_FLAG | N_FLAG;
    expected.a = 0b11111111;
    expected.p = N_FLAG;
    memory_content = 0b01110101;

    run_instruction(ORA_IMM);
}